

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O1

int32_t __thiscall icu_63::RuleBasedBreakIterator::last(RuleBasedBreakIterator *this)

{
  ulong uVar1;
  
  uVar1 = utext_nativeLength_63(&this->fText);
  (*(this->super_BreakIterator).super_UObject._vptr_UObject[0x11])(this,uVar1 & 0xffffffff);
  return (int32_t)uVar1;
}

Assistant:

int32_t RuleBasedBreakIterator::last(void) {
    int32_t endPos = (int32_t)utext_nativeLength(&fText);
    UBool endShouldBeBoundary = isBoundary(endPos);      // Has side effect of setting iterator position.
    (void)endShouldBeBoundary;
    U_ASSERT(endShouldBeBoundary);
    U_ASSERT(fPosition == endPos);
    return endPos;
}